

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

FaceInfo * __thiscall Ptex::v2_2::PtexReader::getFaceInfo(PtexReader *this,int faceid)

{
  pointer pFVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  if (-1 < faceid) {
    uVar2 = (ulong)(uint)faceid;
    pFVar1 = (this->_faceinfo).
             super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->_faceinfo).
                   super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 2) *
            -0x3333333333333333;
    if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
      return pFVar1 + uVar2;
    }
  }
  if ((getFaceInfo(int)::dummy == '\0') &&
     (iVar3 = __cxa_guard_acquire(&getFaceInfo(int)::dummy), iVar3 != 0)) {
    getFaceInfo::dummy.res.ulog2 = '\0';
    getFaceInfo::dummy.res.vlog2 = '\0';
    getFaceInfo::dummy.adjedges = '\0';
    getFaceInfo::dummy.flags = '\0';
    getFaceInfo::dummy.adjfaces[0] = -1;
    getFaceInfo::dummy.adjfaces[1] = -1;
    getFaceInfo::dummy.adjfaces[2] = -1;
    getFaceInfo::dummy.adjfaces[3] = -1;
    __cxa_guard_release(&getFaceInfo(int)::dummy);
  }
  return &getFaceInfo::dummy;
}

Assistant:

const Ptex::FaceInfo& PtexReader::getFaceInfo(int faceid)
{
    if (faceid >= 0 && uint32_t(faceid) < _faceinfo.size())
        return _faceinfo[faceid];

    static Ptex::FaceInfo dummy;
    return dummy;
}